

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  int iVar1;
  realtype *in_RSI;
  ARKodeMem in_RDI;
  realtype rVar2;
  ARKodeERKStepMem step_mem;
  N_Vector *Xvecs;
  realtype *cvals;
  N_Vector yerr;
  N_Vector y;
  int nvec;
  int j;
  int retval;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector x;
  N_Vector_Ops c;
  N_Vector p_Var3;
  int local_24;
  int local_20;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode::ERKStep","erkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    x = (N_Vector)in_RDI->step_mem;
    p_Var3 = (N_Vector)x[2].content;
    c = x[2].ops;
    *in_RSI = 0.0;
    local_24 = 0;
    for (local_20 = 0; local_20 < *(int *)&x[1].content; local_20 = local_20 + 1) {
      (&p_Var3->content)[local_24] =
           (void *)(in_RDI->h * *(double *)((x[1].ops)->nvspace + (long)local_20 * 8));
      (&c->nvgetvectorid)[local_24] = (&x->ops->nvgetvectorid)[local_20];
      local_24 = local_24 + 1;
    }
    (&p_Var3->content)[local_24] = (void *)0x3ff0000000000000;
    (&c->nvgetvectorid)[local_24] = (_func_N_Vector_ID_N_Vector *)in_RDI->yn;
    iVar1 = N_VLinearCombination
                      ((int)((ulong)p_Var3 >> 0x20),(realtype *)c,(N_Vector *)x,
                       in_stack_ffffffffffffffa8);
    if (iVar1 == 0) {
      if (in_RDI->fixedstep == 0) {
        local_24 = 0;
        for (local_20 = 0; local_20 < *(int *)&x[1].content; local_20 = local_20 + 1) {
          (&p_Var3->content)[local_24] =
               (void *)(in_RDI->h *
                       (*(double *)((x[1].ops)->nvspace + (long)local_20 * 8) -
                       *(double *)((x[1].ops)->nvgetarraypointer + (long)local_20 * 8)));
          (&c->nvgetvectorid)[local_24] = (&x->ops->nvgetvectorid)[local_20];
          local_24 = local_24 + 1;
        }
        iVar1 = N_VLinearCombination
                          ((int)((ulong)p_Var3 >> 0x20),(realtype *)c,(N_Vector *)x,
                           in_stack_ffffffffffffffa8);
        if (iVar1 != 0) {
          return -0x1c;
        }
        rVar2 = N_VWrmsNorm(x,in_stack_ffffffffffffffa8);
        *in_RSI = rVar2;
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "erkStep_ComputeSolutions", MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;


  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j=0; j<step_mem->stages; j++) {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}